

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

int sha1_input(sha1_context *context,uint8_t *message_array,uint length)

{
  uint8_t uVar1;
  short sVar2;
  bool bVar3;
  uint local_24;
  uint8_t *puStack_20;
  uint length_local;
  uint8_t *message_array_local;
  sha1_context *context_local;
  
  if (length == 0) {
    context_local._4_4_ = 0;
  }
  else if ((context == (sha1_context *)0x0) || (message_array == (uint8_t *)0x0)) {
    context_local._4_4_ = 1;
  }
  else if (context->computed == 0) {
    local_24 = length;
    puStack_20 = message_array;
    if (context->corrupted == 0) {
      while( true ) {
        bVar3 = false;
        if (local_24 != 0) {
          bVar3 = context->corrupted == 0;
        }
        if (!bVar3) break;
        uVar1 = *puStack_20;
        sVar2 = context->message_block_index;
        context->message_block_index = sVar2 + 1;
        context->message_block[sVar2] = uVar1;
        context->length_low = context->length_low + 8;
        if ((context->length_low == 0) &&
           (context->length_high = context->length_high + 1, context->length_high == 0)) {
          context->corrupted = 1;
        }
        if (context->message_block_index == 0x40) {
          sha1_process_message_block(context);
        }
        puStack_20 = puStack_20 + 1;
        local_24 = local_24 - 1;
      }
      context_local._4_4_ = 0;
    }
    else {
      context_local._4_4_ = context->corrupted;
    }
  }
  else {
    context->corrupted = 3;
    context_local._4_4_ = 3;
  }
  return context_local._4_4_;
}

Assistant:

int sha1_input(sha1_context *context,
               const uint8_t *message_array,
               unsigned length)
{
	if (!length) {
		return SHA_SUCCESS;
	}

	if ((!context) || (!message_array)) {
		return SHA_NULL;
	}

	if (context->computed) {
		context->corrupted = SHA_STATE_ERROR;

		return SHA_STATE_ERROR;
	}

	if (context->corrupted) {
		return context->corrupted;
	}
	while ((length--) && (!context->corrupted)) {
		context->message_block[context->message_block_index++] =
		    (*message_array & 0xFFU);

		context->length_low += 8;
		if (context->length_low == 0) {
			context->length_high++;
			if (context->length_high == 0) {
				/* Message is too long */
				context->corrupted = 1;
			}
		}

		if (context->message_block_index == 64) {
			sha1_process_message_block(context);
		}

		message_array++;
	}

	return SHA_SUCCESS;
}